

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverCreator_AM.h
# Opt level: O0

string * __thiscall
BGIP_SolverCreator_AM<JointPolicyPureVector>::SoftPrintBrief_abi_cxx11_
          (BGIP_SolverCreator_AM<JointPolicyPureVector> *this)

{
  ostream *poVar1;
  long in_RSI;
  string *in_RDI;
  stringstream ss;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"BGIPSC_AltMax_nrSol");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RSI + 0x18));
  poVar1 = std::operator<<(poVar1,"_nrRestarts");
  std::ostream::operator<<(poVar1,*(ulong *)(in_RSI + 8));
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string SoftPrintBrief() const
        {
            std::stringstream ss;
            ss << "BGIPSC_AltMax_nrSol" << _m_nrSolutions
               << "_nrRestarts" << _m_nrRestarts;
            return(ss.str());
        }